

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ConsumeNumber(Parser *this,double *output,ErrorMaker error)

{
  ErrorMaker error_00;
  bool bVar1;
  Token *pTVar2;
  unsigned_long max_value;
  char *pcVar3;
  double dVar4;
  undefined1 auVar5 [16];
  string_view local_78;
  string_view local_68;
  ErrorMaker local_58;
  ErrorMaker local_48;
  uint64_t local_38;
  uint64_t value;
  double *output_local;
  Parser *this_local;
  ErrorMaker error_local;
  
  error_local.field_0 = (anon_union_8_2_7976e4ae_for_ErrorMaker_0)error.func_;
  this_local = (Parser *)error.field_0;
  value = (uint64_t)output;
  output_local = (double *)this;
  bVar1 = LookingAtType(this,TYPE_FLOAT);
  if (bVar1) {
    pTVar2 = io::Tokenizer::current(this->input_);
    dVar4 = io::Tokenizer::ParseFloat(&pTVar2->text);
    *(double *)value = dVar4;
    io::Tokenizer::Next(this->input_);
    error_local.func_._7_1_ = true;
  }
  else {
    bVar1 = LookingAtType(this,TYPE_INTEGER);
    if (bVar1) {
      local_38 = 0;
      pTVar2 = io::Tokenizer::current(this->input_);
      max_value = std::numeric_limits<unsigned_long>::max();
      bVar1 = io::Tokenizer::ParseInteger(&pTVar2->text,max_value,&local_38);
      if (bVar1) {
        auVar5._8_4_ = (int)(local_38 >> 0x20);
        auVar5._0_8_ = local_38;
        auVar5._12_4_ = 0x45300000;
        *(double *)value =
             (auVar5._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)local_38) - 4503599627370496.0);
      }
      else {
        pTVar2 = io::Tokenizer::current(this->input_);
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&pTVar2->text);
        if (*pcVar3 == '0') {
          ErrorMaker::ErrorMaker(&local_48,"Integer out of range.");
          RecordError(this,local_48);
        }
        else {
          pTVar2 = io::Tokenizer::current(this->input_);
          bVar1 = io::Tokenizer::TryParseFloat(&pTVar2->text,(double *)value);
          if (!bVar1) {
            ErrorMaker::ErrorMaker(&local_58,"Integer out of range.");
            RecordError(this,local_58);
          }
        }
      }
      io::Tokenizer::Next(this->input_);
      error_local.func_._7_1_ = true;
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_68,"inf");
      bVar1 = LookingAt(this,local_68);
      if (bVar1) {
        dVar4 = std::numeric_limits<double>::infinity();
        *(double *)value = dVar4;
        io::Tokenizer::Next(this->input_);
        error_local.func_._7_1_ = true;
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_78,"nan");
        bVar1 = LookingAt(this,local_78);
        if (bVar1) {
          dVar4 = std::numeric_limits<double>::quiet_NaN();
          *(double *)value = dVar4;
          io::Tokenizer::Next(this->input_);
          error_local.func_._7_1_ = true;
        }
        else {
          error_00.func_ = (_func_string_void_ptr *)error_local.field_0.error_;
          error_00.field_0.error_ = (char *)this_local;
          RecordError(this,error_00);
          error_local.func_._7_1_ = false;
        }
      }
    }
  }
  return error_local.func_._7_1_;
}

Assistant:

bool Parser::ConsumeNumber(double* output, ErrorMaker error) {
  if (LookingAtType(io::Tokenizer::TYPE_FLOAT)) {
    *output = io::Tokenizer::ParseFloat(input_->current().text);
    input_->Next();
    return true;
  } else if (LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
    // Also accept integers.
    uint64_t value = 0;
    if (io::Tokenizer::ParseInteger(input_->current().text,
                                    std::numeric_limits<uint64_t>::max(),
                                    &value)) {
      *output = value;
    } else if (input_->current().text[0] == '0') {
      // octal or hexadecimal; don't bother parsing as float
      RecordError("Integer out of range.");
      // We still return true because we did, in fact, parse a number.
    } else if (!io::Tokenizer::TryParseFloat(input_->current().text, output)) {
      // out of int range, and not valid float? 🤷
      RecordError("Integer out of range.");
      // We still return true because we did, in fact, parse a number.
    }
    input_->Next();
    return true;
  } else if (LookingAt("inf")) {
    *output = std::numeric_limits<double>::infinity();
    input_->Next();
    return true;
  } else if (LookingAt("nan")) {
    *output = std::numeric_limits<double>::quiet_NaN();
    input_->Next();
    return true;
  } else {
    RecordError(error);
    return false;
  }
}